

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccpp.c
# Opt level: O1

int macro_subst_tok(TokenString *tok_str,Sym **nested_list,Sym *s)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  unsigned_short *puVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  void *p;
  Sym **ppSVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  int iVar20;
  int iVar21;
  int iVar11;
  uint uVar12;
  Sym *extraout_RAX;
  tm *ptVar13;
  Sym *pSVar14;
  int *piVar15;
  Sym *extraout_RAX_00;
  Sym *pSVar16;
  Sym *extraout_RAX_01;
  CValue *pCVar17;
  Sym *extraout_RAX_02;
  char *pcVar18;
  uint uVar19;
  long lVar22;
  int iVar23;
  long lVar24;
  Sym *pSVar25;
  char *fmt;
  Sym *pSVar26;
  undefined1 p_00 [8];
  bool bVar27;
  time_t local_148;
  time_t ti;
  undefined1 auStack_138 [8];
  TokenString str;
  undefined1 auStack_f8 [8];
  char buf [32];
  CValue local_a8;
  undefined1 auStack_98 [8];
  CValue cval;
  Sym *local_78;
  Sym *args;
  Sym *local_68;
  void *local_60;
  Sym **local_58;
  Sym *local_50;
  CValue local_48;
  
  iVar23 = parse_flags;
  local_58 = nested_list;
  if (tok == 0x14d) {
    uVar19 = pp_counter;
    pp_counter = pp_counter + 1;
LAB_001232b2:
    pcVar18 = auStack_f8;
    snprintf(pcVar18,0x20,"%d",(ulong)uVar19);
    iVar23 = 0xbe;
  }
  else {
    if (tok == 0x148) {
      pcVar18 = file->filename;
    }
    else {
      if (tok == 0x147) {
        uVar19 = file->line_num;
        goto LAB_001232b2;
      }
      if (1 < tok - 0x149U) {
        local_50 = (Sym *)(s->field_3).d;
        pSVar16 = local_50;
        if (local_50 == (Sym *)0x0) goto LAB_00123335;
        local_68 = s;
        if ((s->type).t == 1) {
          auStack_f8 = (undefined1  [8])0x0;
          buf[0] = '\0';
          buf[1] = '\0';
          buf[2] = '\0';
          buf[3] = '\0';
          buf[4] = '\0';
          buf[5] = '\0';
          buf[6] = '\0';
          buf[7] = '\0';
          buf[8] = '\0';
          buf[9] = '\0';
          buf[10] = '\0';
          buf[0xb] = '\0';
          buf[0xc] = -1;
          buf[0xd] = -1;
          buf[0xe] = -1;
          buf[0xf] = -1;
          parse_flags = parse_flags | 0x34;
          iVar11 = next_argstream(nested_list,(TokenString *)auStack_f8);
          args = (Sym *)CONCAT44(args._4_4_,iVar11);
          local_60 = (void *)CONCAT44(local_60._4_4_,iVar23);
          if (iVar11 == 0x28) {
            tal_free_impl(tokstr_alloc,(void *)auStack_f8);
            do {
              next_nomacro_spc();
              if (0xff < (long)tok) break;
            } while (tok == 0xcb || (isidnum_table[(long)tok + 1] & 1) != 0);
            local_78 = (Sym *)0x0;
            pSVar16 = (local_68->field_5).next;
LAB_00123478:
            do {
              do {
                next_argstream(local_58,(TokenString *)0x0);
              } while (tok == 10);
            } while (((uint)tok < 0x21 & (byte)(0x100003a00 >> ((byte)tok & 0x3f))) != 0);
LAB_001234c1:
            if (((local_78 != (Sym *)0x0) || (pSVar16 != (Sym *)0x0)) || (tok != 0x29)) {
              if (pSVar16 != (Sym *)0x0) {
                auStack_138 = (undefined1  [8])0x0;
                str.str = (int *)0x0;
                str.len = 0;
                str.lastlen = -1;
                uVar19 = 0;
                iVar23 = 0;
                do {
                  if (iVar23 < 1) {
                    if (tok == 0x2c) {
                      if ((pSVar16->type).t == 0) goto LAB_001235a2;
                    }
                    else if (tok == 0x29) goto LAB_001235a2;
                  }
                  if (tok + 1U < 2) goto LAB_001235a2;
                  if (tok == 0x29) {
                    iVar23 = iVar23 + -1;
                  }
                  else if (tok == 0x28) {
                    iVar23 = iVar23 + 1;
                  }
                  if (tok == 10) {
                    tok = 0x20;
                  }
                  if ((long)tok < 0x100) {
                    bVar27 = uVar19 == 0;
                    uVar19 = isidnum_table[(long)tok + 1] & 1;
                    bVar27 = bVar27 || (isidnum_table[(long)tok + 1] & 1) == 0;
                  }
                  else {
                    uVar19 = 0;
                    bVar27 = true;
                  }
                  if (bVar27) {
                    tok_str_add2((TokenString *)auStack_138,tok,&tokc);
                  }
                  next_argstream(local_58,(TokenString *)0x0);
                } while( true );
              }
              pcVar18 = get_tok_str(local_68->v,(CValue *)0x0);
              fmt = "macro \'%s\' used with too many args";
              goto LAB_00123dd1;
            }
            goto LAB_00123793;
          }
          parse_flags = iVar23;
          tok_str_add(tok_str,tok);
          if (((parse_flags & 0x10U) != 0) && (0 < (int)buf._0_4_)) {
            lVar24 = 0;
            do {
              iVar23 = ((int *)auStack_f8)[lVar24];
              iVar11 = tok_str->len;
              if (iVar11 < tok_str->allocated_len) {
                piVar15 = tok_str->str;
              }
              else {
                piVar15 = tok_str_realloc(tok_str,iVar11 + 1);
              }
              piVar15[iVar11] = iVar23;
              tok_str->len = iVar11 + 1;
              lVar24 = lVar24 + 1;
            } while (lVar24 < (int)buf._0_4_);
          }
          tal_free_impl(tokstr_alloc,(void *)auStack_f8);
          pSVar16 = extraout_RAX_00;
          goto LAB_00123803;
        }
        goto LAB_0012381c;
      }
      time(&local_148);
      ptVar13 = localtime(&local_148);
      if (tok == 0x149) {
        pcVar18 = auStack_f8;
        snprintf(pcVar18,0x20,"%s %2d %d",ab_month_name + ptVar13->tm_mon,
                 (ulong)(uint)ptVar13->tm_mday,(ulong)(ptVar13->tm_year + 0x76c));
      }
      else {
        pcVar18 = auStack_f8;
        snprintf(pcVar18,0x20,"%02d:%02d:%02d",(ulong)(uint)ptVar13->tm_hour,
                 (ulong)(uint)ptVar13->tm_min,(ulong)(uint)ptVar13->tm_sec);
      }
    }
    iVar23 = 0xb9;
  }
  auStack_138 = (undefined1  [8])0x0;
  str.str = (int *)0x0;
  str.len = 0;
  str.lastlen = 0;
  cstr_cat((CString *)auStack_138,pcVar18,0);
  piVar15 = str.str;
  auStack_98._0_4_ = auStack_138._0_4_;
  cval.d = (double)str.str;
  tok_str_add2(tok_str,iVar23,(CValue *)auStack_98);
  tal_free_impl(cstr_alloc,piVar15);
  pSVar16 = extraout_RAX;
LAB_00123335:
  return (int)pSVar16;
LAB_001235a2:
  if (iVar23 != 0) {
    expect(")");
  }
  lVar24 = (long)(int)str.str;
  iVar23 = (int)(lVar24 - (int)uVar19);
  str.str = (int *)CONCAT44(str.str._4_4_,iVar23);
  if (str.len <= iVar23) {
    iVar11 = 0x10;
    if (0x10 < str.len) {
      iVar11 = str.len;
    }
    do {
      iVar21 = iVar11;
      iVar11 = iVar21 * 2;
    } while (iVar21 <= iVar23);
    if (str.len < iVar21) {
      auStack_138 = (undefined1  [8])tal_realloc_impl(&tokstr_alloc,(void *)auStack_138,iVar21 * 4);
      str.len = iVar21;
    }
  }
  iVar11 = iVar23 + 1;
  *(int *)((long)auStack_138 + (lVar24 - (int)uVar19) * 4) = -1;
  str.str = (int *)CONCAT44(str.str._4_4_,iVar11);
  if (str.len <= iVar11) {
    iVar21 = 0x10;
    if (0x10 < str.len) {
      iVar21 = str.len;
    }
    do {
      iVar20 = iVar21;
      iVar21 = iVar20 * 2;
    } while (iVar20 < iVar23 + 2);
    if (str.len < iVar20) {
      auStack_138 = (undefined1  [8])tal_realloc_impl(&tokstr_alloc,(void *)auStack_138,iVar20 * 4);
      str.len = iVar20;
    }
  }
  *(int *)((long)auStack_138 + (long)iVar11 * 4) = 0;
  str.str = (int *)CONCAT44(str.str._4_4_,iVar23 + 2);
  pSVar14 = sym_push2(&local_78,pSVar16->v & 0xdfffffff,(pSVar16->type).t,0);
  (pSVar14->field_3).d = (int *)auStack_138;
  pSVar16 = (pSVar16->field_5).next;
  if (tok != 0x29) goto code_r0x001236d1;
  if (pSVar16 != (Sym *)0x0) {
    if (((pSVar16->type).t == 0) || (gnu_ext == 0)) {
      pcVar18 = get_tok_str(local_68->v,(CValue *)0x0);
      fmt = "macro \'%s\' used with too few args";
LAB_00123dd1:
      tcc_error(fmt,pcVar18);
    }
    goto LAB_001234c1;
  }
LAB_00123793:
  parse_flags = (int)local_60;
  pSVar16 = (Sym *)macro_arg_subst(local_58,&local_50->v,local_78);
  local_50 = pSVar16;
  pSVar14 = local_78;
  while (pSVar14 != (Sym *)0x0) {
    pSVar25 = pSVar14->prev;
    tal_free_impl(tokstr_alloc,(pSVar14->field_3).d);
    if ((pSVar14->field_5).next != (Sym *)0x0) {
      tal_free_impl(tokstr_alloc,(((pSVar14->field_5).next)->field_3).d);
      sym_free((pSVar14->field_5).next);
    }
    sym_free(pSVar14);
    pSVar16 = extraout_RAX_01;
    pSVar14 = pSVar25;
  }
LAB_00123803:
  iVar23 = (int)local_60;
  if ((int)args != 0x28) goto LAB_00123335;
LAB_0012381c:
  sym_push2(local_58,local_68->v,0,0);
  pSVar16 = local_50;
  do {
    pSVar14 = (Sym *)&pSVar16->r;
    iVar11 = pSVar16->v;
    switch(iVar11) {
    case 0xb3:
    case 0xb4:
    case 0xb5:
    case 0xc0:
      iVar21._0_2_ = pSVar16->r;
      iVar21._2_2_ = pSVar16->a;
      local_48.d = (double)(long)iVar21;
      goto LAB_0012387a;
    case 0xb6:
      uVar19._0_2_ = pSVar16->r;
      uVar19._2_2_ = pSVar16->a;
      local_48.d = (double)(ulong)uVar19;
LAB_0012387a:
      pSVar16 = (Sym *)&pSVar16->field_3;
      break;
    case 0xb7:
    case 0xb8:
    case 0xbc:
    case 0xce:
    case 0xcf:
      iVar21 = 2;
      goto LAB_00123858;
    case 0xb9:
    case 0xba:
    case 0xbe:
    case 0xbf:
      local_48.str.data = &pSVar16->field_3;
      local_48.i._0_2_ = pSVar16->r;
      local_48.i._2_2_ = pSVar16->a;
      pSVar16 = (Sym *)((long)&pSVar16->field_3 +
                       ((long)local_48.str.size + 3U & 0xfffffffffffffffc));
      break;
    case 0xbb:
      uVar1 = pSVar16->r;
      uVar3 = pSVar16->a;
      local_48.i._2_2_ = uVar3;
      local_48.i._0_2_ = uVar1;
      pSVar16 = (Sym *)&pSVar16->field_3;
      break;
    case 0xbd:
      iVar21 = 4;
LAB_00123858:
      lVar24 = 0;
      do {
        lVar22 = lVar24;
        *(undefined4 *)((long)&local_48 + lVar22) = *(undefined4 *)((long)pSVar14 + lVar22);
        lVar24 = lVar22 + 4;
      } while (iVar21 << 2 != (int)(lVar22 + 4));
      pSVar14 = (Sym *)((long)pSVar14 + lVar22 + 4);
switchD_00123851_caseD_c1:
      pSVar16 = pSVar14;
      break;
    default:
      goto switchD_00123851_caseD_c1;
    }
    parse_flags = iVar23;
    if (iVar11 == 0) {
      p_00 = (undefined1  [8])0x0;
      goto LAB_00123d37;
    }
  } while (iVar11 != 0xcd);
  auStack_f8 = (undefined1  [8])0x0;
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = -1;
  buf[0xd] = -1;
  buf[0xe] = -1;
  buf[0xf] = -1;
  iVar23 = -1;
  pSVar16 = local_50;
LAB_001238fe:
  do {
    pSVar14 = (Sym *)&pSVar16->r;
    uVar19 = pSVar16->v;
    pSVar25 = (Sym *)(ulong)uVar19;
    switch(uVar19) {
    case 0xb3:
    case 0xb4:
    case 0xb5:
    case 0xc0:
      iVar11._0_2_ = pSVar16->r;
      iVar11._2_2_ = pSVar16->a;
      local_48.d = (double)(long)iVar11;
      goto LAB_00123941;
    case 0xb6:
      uVar12._0_2_ = pSVar16->r;
      uVar12._2_2_ = pSVar16->a;
      local_48.d = (double)(ulong)uVar12;
LAB_00123941:
      pSVar16 = (Sym *)&pSVar16->field_3;
      break;
    case 0xb7:
    case 0xb8:
    case 0xbc:
    case 0xce:
    case 0xcf:
      iVar11 = 2;
      goto LAB_0012391f;
    case 0xb9:
    case 0xba:
    case 0xbe:
    case 0xbf:
      local_48.str.data = &pSVar16->field_3;
      local_48.i._0_2_ = pSVar16->r;
      local_48.i._2_2_ = pSVar16->a;
      pSVar16 = (Sym *)((long)&pSVar16->field_3 +
                       ((long)local_48.str.size + 3U & 0xfffffffffffffffc));
      break;
    case 0xbb:
      uVar2 = pSVar16->r;
      uVar4 = pSVar16->a;
      local_48.i._2_2_ = uVar4;
      local_48.i._0_2_ = uVar2;
      pSVar16 = (Sym *)&pSVar16->field_3;
      break;
    case 0xbd:
      iVar11 = 4;
LAB_0012391f:
      lVar24 = 0;
      do {
        lVar22 = lVar24;
        *(undefined4 *)((long)&local_48 + lVar22) = *(undefined4 *)((long)pSVar14 + lVar22);
        lVar24 = lVar22 + 4;
      } while (iVar11 << 2 != (int)(lVar22 + 4));
      pSVar14 = (Sym *)((long)pSVar14 + lVar22 + 4);
switchD_00123918_caseD_c1:
      pSVar16 = pSVar14;
      break;
    default:
      goto switchD_00123918_caseD_c1;
    }
  } while (uVar19 == 0xcd);
  if (uVar19 != 0) {
    iVar20._0_2_ = *(unsigned_short *)&pSVar16->v;
    iVar20._2_2_ = *(SymAttr *)((long)&pSVar16->v + 2);
    uVar6 = buf._0_8_;
    uVar10 = local_a8.d;
    while (iVar11 = (int)pSVar25, buf._0_8_ = uVar6, local_a8.i = uVar10, iVar20 == 0xcd) {
      if (-1 < iVar23) {
        buf._4_4_ = SUB84(uVar6,4);
        buf[0] = (char)iVar23;
        buf[1] = (char)((uint)iVar23 >> 8);
        buf[2] = (char)((uint)iVar23 >> 0x10);
        buf[3] = (char)((uint)iVar23 >> 0x18);
      }
      pSVar14 = (Sym *)&pSVar16->field_3;
      do {
        pSVar26 = pSVar14;
        uVar19 = *(uint *)((long)&pSVar26[-1].prev_tok + 4);
        pSVar14 = (Sym *)&pSVar26->r;
      } while (uVar19 == 0xcc);
      if ((uVar19 == 0) || (uVar19 == 0xcd)) {
        pSVar16 = (Sym *)((long)&pSVar26[-1].prev_tok + 4);
        goto LAB_001239c4;
      }
      local_a8.tab[1] = (int)((ulong)uVar10 >> 0x20);
      pSVar16 = pSVar26;
      switch(uVar19) {
      case 0xb3:
      case 0xb4:
      case 0xb5:
      case 0xc0:
        pSVar16 = pSVar14;
        uVar10 = (long)pSVar26->v;
        break;
      case 0xb6:
        pSVar16 = pSVar14;
        uVar10 = (ulong)(uint)pSVar26->v;
        break;
      case 0xb7:
      case 0xb8:
      case 0xbc:
      case 0xce:
      case 0xcf:
        iVar21 = 2;
        goto LAB_001239f2;
      case 0xb9:
      case 0xba:
      case 0xbe:
      case 0xbf:
        local_a8.str.size = pSVar26->v;
        pSVar16 = (Sym *)((long)pSVar14 + ((long)pSVar26->v + 3U & 0xfffffffffffffffc));
        uVar10 = local_a8.i;
        local_a8.str.data = pSVar14;
        break;
      case 0xbb:
        local_a8.f = (float)pSVar26->v;
        pSVar16 = pSVar14;
        uVar10 = local_a8.i;
        break;
      case 0xbd:
        iVar21 = 4;
LAB_001239f2:
        lVar24 = 0;
        do {
          puVar5 = (unsigned_short *)&pSVar26->v;
          pSVar26 = (Sym *)&pSVar26->r;
          *(int *)((long)&local_a8 + lVar24 * 4) = *(int *)puVar5;
          lVar24 = lVar24 + 1;
          pSVar16 = pSVar26;
          uVar10 = local_a8.i;
        } while (iVar21 != (int)lVar24);
      }
      local_a8.i = uVar10;
      if ((iVar11 != 0xcb) || (uVar19 != 0xcb)) {
        auStack_98 = (undefined1  [8])0x0;
        cval.d = 0.0;
        cval.str.data = (void *)0x0;
        args = pSVar25;
        if (iVar11 != 0xcb) {
          pcVar18 = get_tok_str(iVar11,&local_48);
          cstr_cat((CString *)auStack_98,pcVar18,-1);
        }
        ti = (time_t)(int)auStack_98._0_4_;
        if (uVar19 != 0xcb) {
          pcVar18 = get_tok_str(uVar19,&local_a8);
          cstr_cat((CString *)auStack_98,pcVar18,-1);
        }
        uVar7 = auStack_98._0_4_;
        lVar24 = (long)(int)auStack_98._0_4_;
        if (cval.tab[2] <= (int)auStack_98._0_4_) {
          uVar9 = cval.tab[2];
          if (cval.tab[2] < 9) {
            uVar9 = 8;
          }
          do {
            uVar12 = uVar9;
            uVar9 = uVar12 * 2;
          } while ((int)uVar12 <= (int)auStack_98._0_4_);
          cval.d = (double)tal_realloc_impl(&cstr_alloc,cval.d,uVar12);
          cval.tab[2] = uVar12;
        }
        uVar6 = cval.d;
        iVar11 = uVar7 + 1;
        *(undefined1 *)(cval.i + lVar24) = 0;
        auStack_98._0_4_ = iVar11;
        tcc_open_bf(tcc_state,":paste:",iVar11);
        local_60 = (void *)uVar6;
        memcpy(file->buffer,(void *)uVar6,(long)iVar11);
        tok_flags = 0;
        do {
          next_nomacro1();
          p = local_60;
          bVar27 = *file->buf_ptr == '\0';
          if (bVar27) {
            tcc_close();
            tal_free_impl(cstr_alloc,local_60);
            goto LAB_00123c0b;
          }
        } while (((ulong)(uint)tok < 0x21) && ((0x100003a00U >> ((ulong)(uint)tok & 0x3f) & 1) != 0)
                );
        tcc_warning("pasting \"%.*s\" and \"%s\" does not give a valid preprocessing token",ti,
                    local_60,ti + (long)local_60);
        tcc_close();
        tal_free_impl(cstr_alloc,p);
        if (bVar27) {
LAB_00123c0b:
          pCVar17 = &tokc;
          uVar19 = tok;
        }
        else {
          tok_str_add2((TokenString *)auStack_f8,(int)args,&local_48);
          pCVar17 = &local_a8;
        }
        local_48.d = pCVar17->d;
        local_48.str.data = (void *)(&pCVar17->d)[1];
        pSVar25 = (Sym *)(ulong)uVar19;
      }
LAB_001239c4:
      iVar20._0_2_ = *(unsigned_short *)&pSVar16->v;
      iVar20._2_2_ = *(SymAttr *)((long)&pSVar16->v + 2);
      uVar6 = buf._0_8_;
      uVar10 = local_a8.i;
    }
    buf._0_4_ = iVar23;
    if (iVar23 < 0) {
      buf._0_4_ = (undefined4)uVar6;
    }
    iVar23 = buf._0_4_;
    if (iVar11 != 0xcc) {
      iVar23 = -1;
    }
    tok_str_add2((TokenString *)auStack_f8,iVar11,&local_48);
    goto LAB_001238fe;
  }
  uVar7 = buf._0_4_;
  lVar24 = (long)(int)buf._0_4_;
  if ((int)buf._8_4_ <= (int)buf._0_4_) {
    iVar23 = 0x10;
    if (0x10 < (int)buf._8_4_) {
      iVar23 = buf._8_4_;
    }
    do {
      iVar11 = iVar23;
      iVar23 = iVar11 * 2;
    } while (iVar11 <= (int)buf._0_4_);
    if ((int)buf._8_4_ < iVar11) {
      auStack_f8 = (undefined1  [8])tal_realloc_impl(&tokstr_alloc,(void *)auStack_f8,iVar11 * 4);
      buf[8] = (char)iVar11;
      buf[9] = (char)((uint)iVar11 >> 8);
      buf[10] = (char)((uint)iVar11 >> 0x10);
      buf[0xb] = (char)((uint)iVar11 >> 0x18);
    }
  }
  ((int *)auStack_f8)[lVar24] = 0;
  buf._0_4_ = uVar7 + 1;
  p_00 = auStack_f8;
LAB_00123d37:
  ppSVar8 = local_58;
  pSVar16 = (Sym *)p_00;
  if (p_00 == (undefined1  [8])0x0) {
    pSVar16 = local_50;
  }
  macro_subst(tok_str,local_58,&pSVar16->v);
  pSVar16 = *ppSVar8;
  *ppSVar8 = pSVar16->prev;
  sym_free(pSVar16);
  if (p_00 != (undefined1  [8])0x0) {
    tal_free_impl(tokstr_alloc,(void *)p_00);
  }
  pSVar16 = local_68;
  if (local_50 != (Sym *)(local_68->field_3).enum_val) {
    tal_free_impl(tokstr_alloc,local_50);
    pSVar16 = extraout_RAX_02;
  }
  goto LAB_00123335;
code_r0x001236d1:
  if (tok != 0x2c) {
    expect(",");
  }
  goto LAB_00123478;
}

Assistant:

static int macro_subst_tok(TokenString* tok_str, Sym** nested_list, Sym* s) {
  Sym *args, *sa, *sa1;
  int parlevel, t, t1, spc;
  TokenString str;
  char* cstrval;
  CValue cval;
  CString cstr;
  char buf[32];

  /* if symbol is a macro, prepare substitution */
  /* special macros */
  if (tok == TOK___LINE__ || tok == TOK___COUNTER__) {
    t = tok == TOK___LINE__ ? file->line_num : pp_counter++;
    snprintf(buf, sizeof(buf), "%d", t);
    cstrval = buf;
    t1 = TOK_PPNUM;
    goto add_cstr1;
  } else if (tok == TOK___FILE__) {
    cstrval = file->filename;
    goto add_cstr;
  } else if (tok == TOK___DATE__ || tok == TOK___TIME__) {
    time_t ti;
    struct tm* tm;

    time(&ti);
    tm = localtime(&ti);
    if (tok == TOK___DATE__) {
      snprintf(buf, sizeof(buf), "%s %2d %d", ab_month_name[tm->tm_mon], tm->tm_mday, tm->tm_year + 1900);
    } else {
      snprintf(buf, sizeof(buf), "%02d:%02d:%02d", tm->tm_hour, tm->tm_min, tm->tm_sec);
    }
    cstrval = buf;
  add_cstr:
    t1 = TOK_STR;
  add_cstr1:
    cstr_new(&cstr);
    cstr_cat(&cstr, cstrval, 0);
    cval.str.size = cstr.size;
    cval.str.data = cstr.data;
    tok_str_add2(tok_str, t1, &cval);
    cstr_free(&cstr);
  } else if (s->d) {
    int saved_parse_flags = parse_flags;
    int* joined_str = NULL;
    int* mstr = s->d;

    if (s->type.t == MACRO_FUNC) {
      /* whitespace between macro name and argument list */
      TokenString ws_str;
      tok_str_new(&ws_str);

      spc = 0;
      parse_flags |= PARSE_FLAG_SPACES | PARSE_FLAG_LINEFEED | PARSE_FLAG_ACCEPT_STRAYS;

      /* get next token from argument stream */
      t = next_argstream(nested_list, &ws_str);
      if (t != '(') {
        /* not a macro substitution after all, restore the
         * macro token plus all whitespace we've read.
         * whitespace is intentionally not merged to preserve
         * newlines. */
        parse_flags = saved_parse_flags;
        tok_str_add(tok_str, tok);
        if (parse_flags & PARSE_FLAG_SPACES) {
          int i;
          for (i = 0; i < ws_str.len; i++)
            tok_str_add(tok_str, ws_str.str[i]);
        }
        tok_str_free_str(ws_str.str);
        return 0;
      } else {
        tok_str_free_str(ws_str.str);
      }
      do {
        next_nomacro(); /* eat '(' */
      } while (tok == TOK_PLCHLDR);

      /* argument macro */
      args = NULL;
      sa = s->next;
      /* NOTE: empty args are allowed, except if no args */
      for (;;) {
        do {
          next_argstream(nested_list, NULL);
        } while (is_space(tok) || TOK_LINEFEED == tok);
      empty_arg:
        /* handle '()' case */
        if (!args && !sa && tok == ')')
          break;
        if (!sa)
          tcc_error("macro '%s' used with too many args", get_tok_str(s->v, 0));
        tok_str_new(&str);
        parlevel = spc = 0;
        /* NOTE: non zero sa->t indicates VA_ARGS */
        while ((parlevel > 0 || (tok != ')' && (tok != ',' || sa->type.t)))) {
          if (tok == TOK_EOF || tok == 0)
            break;
          if (tok == '(')
            parlevel++;
          else if (tok == ')')
            parlevel--;
          if (tok == TOK_LINEFEED)
            tok = ' ';
          if (!check_space(tok, &spc))
            tok_str_add2(&str, tok, &tokc);
          next_argstream(nested_list, NULL);
        }
        if (parlevel)
          expect(")");
        str.len -= spc;
        tok_str_add(&str, -1);
        tok_str_add(&str, 0);
        sa1 = sym_push2(&args, sa->v & ~SYM_FIELD, sa->type.t, 0);
        sa1->d = str.str;
        sa = sa->next;
        if (tok == ')') {
          /* special case for gcc var args: add an empty
             var arg argument if it is omitted */
          if (sa && sa->type.t && gnu_ext)
            goto empty_arg;
          break;
        }
        if (tok != ',')
          expect(",");
      }
      if (sa) {
        tcc_error("macro '%s' used with too few args", get_tok_str(s->v, 0));
      }

      parse_flags = saved_parse_flags;

      /* now subst each arg */
      mstr = macro_arg_subst(nested_list, mstr, args);
      /* free memory */
      sa = args;
      while (sa) {
        sa1 = sa->prev;
        tok_str_free_str(sa->d);
        if (sa->next) {
          tok_str_free_str(sa->next->d);
          sym_free(sa->next);
        }
        sym_free(sa);
        sa = sa1;
      }
    }

    sym_push2(nested_list, s->v, 0, 0);
    parse_flags = saved_parse_flags;
    joined_str = macro_twosharps(mstr);
    macro_subst(tok_str, nested_list, joined_str ? joined_str : mstr);

    /* pop nested defined symbol */
    sa1 = *nested_list;
    *nested_list = sa1->prev;
    sym_free(sa1);
    if (joined_str)
      tok_str_free_str(joined_str);
    if (mstr != s->d)
      tok_str_free_str(mstr);
  }
  return 0;
}